

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Bitset * __thiscall
spirv_cross::ParsedIR::get_buffer_block_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  TypedID<(spirv_cross::Types)1> TVar2;
  SPIRType *pSVar3;
  Meta *pMVar4;
  Bitset *pBVar5;
  size_t sVar6;
  uint local_98;
  uint32_t i;
  Bitset all_members_flags;
  Meta *m;
  SPIRType *type;
  SPIRVariable *var_local;
  ParsedIR *this_local;
  Bitset *base_flags;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = get<spirv_cross::SPIRType>(this,id);
  if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
    Bitset::Bitset(__return_storage_ptr__);
    pMVar4 = find_meta(this,(ID)(var->super_IVariant).self.id);
    if (pMVar4 != (Meta *)0x0) {
      Bitset::operator=(__return_storage_ptr__,&(pMVar4->decoration).decoration_flags);
    }
    bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                      (&(pSVar3->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if (!bVar1) {
      TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
      pBVar5 = get_member_decoration_bitset(this,(TypeID)TVar2.id,0);
      Bitset::Bitset((Bitset *)&i,pBVar5);
      for (local_98 = 1;
          sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSVar3->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
          local_98 < (uint)sVar6; local_98 = local_98 + 1) {
        TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
        pBVar5 = get_member_decoration_bitset(this,(TypeID)TVar2.id,local_98);
        Bitset::merge_and((Bitset *)&i,pBVar5);
      }
      Bitset::merge_or(__return_storage_ptr__,(Bitset *)&i);
      all_members_flags.higher._M_h._M_single_bucket._0_4_ = 1;
      Bitset::~Bitset((Bitset *)&i);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                ,0x214,
                "Bitset spirv_cross::ParsedIR::get_buffer_block_flags(const SPIRVariable &) const");
}

Assistant:

Bitset ParsedIR::get_buffer_block_flags(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	assert(type.basetype == SPIRType::Struct);

	// Some flags like non-writable, non-readable are actually found
	// as member decorations. If all members have a decoration set, propagate
	// the decoration up as a regular variable decoration.
	Bitset base_flags;
	auto *m = find_meta(var.self);
	if (m)
		base_flags = m->decoration.decoration_flags;

	if (type.member_types.empty())
		return base_flags;

	Bitset all_members_flags = get_member_decoration_bitset(type.self, 0);
	for (uint32_t i = 1; i < uint32_t(type.member_types.size()); i++)
		all_members_flags.merge_and(get_member_decoration_bitset(type.self, i));

	base_flags.merge_or(all_members_flags);
	return base_flags;
}